

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

RENDER_DEVICE_TYPE Diligent::ArchiveDataFlagToRenderDeviceType(ARCHIVE_DEVICE_DATA_FLAGS Flag)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  ARCHIVE_DEVICE_DATA_FLAGS Flag_local;
  
  msg.field_2._8_4_ = Flag;
  bVar1 = IsPowerOfTwo<Diligent::ARCHIVE_DEVICE_DATA_FLAGS>(Flag);
  if (!bVar1) {
    FormatString<char[29]>((string *)local_30,(char (*) [29])"Exactly one flag is expected");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ArchiveDataFlagToRenderDeviceType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x791);
    std::__cxx11::string::~string((string *)local_30);
  }
  if (msg.field_2._8_4_ == 1) {
    msg.field_2._12_4_ = 1;
  }
  else if (msg.field_2._8_4_ == 2) {
    msg.field_2._12_4_ = 2;
  }
  else if (msg.field_2._8_4_ == 4) {
    msg.field_2._12_4_ = 3;
  }
  else if (msg.field_2._8_4_ == 8) {
    msg.field_2._12_4_ = 4;
  }
  else if (msg.field_2._8_4_ == 0x10) {
    msg.field_2._12_4_ = 5;
  }
  else if ((msg.field_2._8_4_ == 0x20) || (msg.field_2._8_4_ == 0x40)) {
    msg.field_2._12_4_ = 6;
  }
  else if (msg.field_2._8_4_ == 0x80) {
    msg.field_2._12_4_ = 7;
  }
  else {
    FormatString<char[36]>((string *)local_60,(char (*) [36])"Unexpected archive device data flag");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ArchiveDataFlagToRenderDeviceType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x7ab);
    std::__cxx11::string::~string((string *)local_60);
    msg.field_2._12_4_ = 0;
  }
  return msg.field_2._12_4_;
}

Assistant:

RENDER_DEVICE_TYPE ArchiveDataFlagToRenderDeviceType(ARCHIVE_DEVICE_DATA_FLAGS Flag)
{
    VERIFY(IsPowerOfTwo(Flag), "Exactly one flag is expected");
    switch (Flag)
    {
        case ARCHIVE_DEVICE_DATA_FLAG_D3D11:
            return RENDER_DEVICE_TYPE_D3D11;

        case ARCHIVE_DEVICE_DATA_FLAG_D3D12:
            return RENDER_DEVICE_TYPE_D3D12;

        case ARCHIVE_DEVICE_DATA_FLAG_GL:
            return RENDER_DEVICE_TYPE_GL;

        case ARCHIVE_DEVICE_DATA_FLAG_GLES:
            return RENDER_DEVICE_TYPE_GLES;

        case ARCHIVE_DEVICE_DATA_FLAG_VULKAN:
            return RENDER_DEVICE_TYPE_VULKAN;

        case ARCHIVE_DEVICE_DATA_FLAG_METAL_MACOS:
        case ARCHIVE_DEVICE_DATA_FLAG_METAL_IOS:
            return RENDER_DEVICE_TYPE_METAL;

        case ARCHIVE_DEVICE_DATA_FLAG_WEBGPU:
            return RENDER_DEVICE_TYPE_WEBGPU;

        default:
            UNEXPECTED("Unexpected archive device data flag");
            return RENDER_DEVICE_TYPE_UNDEFINED;
    }
}